

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralSubstitutionTree.hpp
# Opt level: O2

void __thiscall
Indexing::LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::
LiteralSubstitutionTree
          (LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> *this)

{
  (this->super_LiteralIndexingStructure<Inferences::ALASCA::BinaryResolutionConf::Lhs>).
  _vptr_LiteralIndexingStructure = (_func_int **)&PTR__LiteralSubstitutionTree_009ef070;
  Lib::
  Stack<std::unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>
  ::Stack(&this->_trees,
          (ulong)((uint)((ulong)(*(long *)(DAT_00a14190 + 0x88) - *(long *)(DAT_00a14190 + 0x80)) >>
                        2) & 0xfffffffe));
  return;
}

Assistant:

LiteralSubstitutionTree()
    : _trees(env.signature->predicates() * 2)
    { }